

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::
     HistogramBinUpdateFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::HistogramExact>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  pointer puVar1;
  HistogramBinState<duckdb::string_t> *this;
  unsafe_vector<duckdb::string_t> *puVar2;
  idx_t iVar3;
  unsafe_vector<duckdb::string_t> *bin_boundaries;
  unsafe_vector<duckdb::string_t> *puVar4;
  idx_t i;
  unsafe_vector<duckdb::string_t> *pos;
  string_t value;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  Vector extra_state;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  Vector::ToUnifiedFormat(state_vector,count,&local_e0);
  HistogramGenericFunctor::CreateExtraState(&local_98,count);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  HistogramGenericFunctor::PrepareData(inputs,count,&local_98,&local_128);
  for (pos = (unsafe_vector<duckdb::string_t> *)0x0; (unsafe_vector<duckdb::string_t> *)count != pos
      ; pos = (unsafe_vector<duckdb::string_t> *)
              ((long)&(pos->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                      super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1)) {
    puVar4 = pos;
    if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
      puVar4 = (unsafe_vector<duckdb::string_t> *)(ulong)(local_128.sel)->sel_vector[(long)pos];
    }
    if ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
         [(ulong)puVar4 >> 6] >> ((ulong)puVar4 & 0x3f) & 1) != 0)) {
      bin_boundaries = (unsafe_vector<duckdb::string_t> *)(local_e0.sel)->sel_vector;
      puVar2 = pos;
      if (bin_boundaries != (unsafe_vector<duckdb::string_t> *)0x0) {
        puVar2 = (unsafe_vector<duckdb::string_t> *)
                 (ulong)*(uint *)((long)&(bin_boundaries->
                                         super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                                         ).
                                         super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start + (long)pos * 4);
      }
      this = *(HistogramBinState<duckdb::string_t> **)(local_e0.data + (long)puVar2 * 8);
      puVar2 = this->bin_boundaries;
      if (puVar2 == (unsafe_vector<duckdb::string_t> *)0x0) {
        bin_boundaries = pos;
        HistogramBinState<duckdb::string_t>::InitializeBins<duckdb::HistogramGenericFunctor>
                  (this,inputs + 1,count,(idx_t)pos,aggr_input);
        puVar2 = this->bin_boundaries;
      }
      value.value.pointer.ptr = (char *)puVar2;
      value.value._0_8_ = *(undefined8 *)(local_128.data + (long)puVar4 * 0x10 + 8);
      iVar3 = HistogramExact::GetBin<duckdb::string_t>
                        (*(HistogramExact **)(local_128.data + (long)puVar4 * 0x10),value,
                         bin_boundaries);
      puVar1 = (this->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      *puVar1 = *puVar1 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_128);
  Vector::~Vector(&local_98);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_e0);
  return;
}

Assistant:

static void HistogramBinUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                       Vector &state_vector, idx_t count) {
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &bin_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.IsSet()) {
			state.template InitializeBins<OP>(bin_vector, count, i, aggr_input);
		}
		auto bin_entry = HIST::template GetBin<T>(data[idx], *state.bin_boundaries);
		++(*state.counts)[bin_entry];
	}
}